

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O3

void __thiscall soul::Program::Program(Program *this,ProgramImpl *p,bool holdRef)

{
  undefined3 in_register_00000011;
  
  this->pimpl = p;
  (this->refHolder).object = (ProgramImpl *)0x0;
  if (CONCAT31(in_register_00000011,holdRef) != 0) {
    (p->super_RefCountedObject).refCount = (p->super_RefCountedObject).refCount + 1;
    (this->refHolder).object = p;
    RefCountedPtr<soul::Program::ProgramImpl>::decIfNotNull((ProgramImpl *)0x0);
    RefCountedPtr<soul::Program::ProgramImpl>::decIfNotNull((ProgramImpl *)0x0);
  }
  return;
}

Assistant:

Program::Program (ProgramImpl& p, bool holdRef) : pimpl (&p) { if (holdRef) refHolder = p; }